

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O1

void __thiscall Arena_PtrNoConNoDecon_Test::TestBody(Arena_PtrNoConNoDecon_Test *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *in_R9;
  pointer *__ptr;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr2;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr3;
  AssertionResult gtest_ar_;
  Arena arena;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  ptr4;
  AssertionResult gtest_ar__2;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  local_b0;
  string local_a0;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  long local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
  local_38;
  AssertHelper local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  memt::Arena::Arena((Arena *)&local_60);
  local_80[0] = local_60._M_allocated_capacity == local_60._8_8_ && local_48 == 0;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60._M_allocated_capacity == local_60._8_8_ && local_48 == 0) {
    local_80 = (undefined1  [8])&local_60;
    if ((ulong)(local_50 - local_60._8_8_) < 8) {
      memt::Arena::growCapacity((Arena *)&local_60,8);
    }
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._8_8_;
    local_60._8_8_ = local_60._8_8_ + 8;
    local_c0[0] = (internal)(local_60._8_8_ != local_60._M_allocated_capacity || local_48 != 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_60._8_8_ == local_60._M_allocated_capacity && local_48 == 0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)local_c0,(AssertionResult *)"arena.isEmpty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd3,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.mArena !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_b0.mArena + 8))();
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
    }
    else {
      local_c0 = (undefined1  [8])&local_60;
      if ((ulong)(local_50 - local_60._8_8_) < 8) {
        memt::Arena::growCapacity((Arena *)&local_60,8);
      }
      psVar1 = (size_type *)(local_60._8_8_ + 8);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._8_8_
      ;
      local_b0.mArena = (Arena *)&local_60;
      local_60._8_8_ = psVar1;
      if ((ulong)(local_50 - (long)psVar1) < 8) {
        memt::Arena::growCapacity((Arena *)&local_60,8);
      }
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_60._8_8_ + 8);
      local_b0.mPtr =
           (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
           local_60._8_8_;
      local_60._8_8_ = paVar2;
      local_38.mArena = (Arena *)&local_60;
      if ((ulong)(local_50 - (long)paVar2->_M_local_buf) < 8) {
        memt::Arena::growCapacity((Arena *)&local_60,8);
      }
      local_38.mPtr =
           (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
           local_60._8_8_;
      local_60._8_8_ = local_60._8_8_ + 8;
      local_20[0] = (internal)(local_60._8_8_ != local_60._M_allocated_capacity || local_48 != 0);
      local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_60._8_8_ != local_60._M_allocated_capacity || local_48 != 0) {
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon(&local_38);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon(&local_b0);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)local_c0);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)local_80);
        local_80[0] = local_60._M_allocated_capacity == local_60._8_8_ && local_48 == 0;
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_60._M_allocated_capacity != local_60._8_8_ || local_48 != 0) {
          testing::Message::Message((Message *)local_c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a0,(internal *)local_80,(AssertionResult *)"arena.isEmpty()","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xd9,local_a0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_c0);
          goto LAB_0010ff35;
        }
        std::__cxx11::stringbuf::str();
        std::ios::clear((int)*(undefined8 *)
                              ((anonymous_namespace)::
                               _frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,0ul>
                               ::_log_abi_cxx11_ + -0x18) + 0x15dc00);
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::stringbuf::str((string *)&DAT_0015dc08);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        message = "";
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
                  ((internal *)local_c0,"PtrNoConNoDeconHelper::resetLog()","\"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char (*) [1])0x145837);
        if (local_80 != (undefined1  [8])&local_70) {
          operator_delete((void *)local_80,local_70._M_allocated_capacity + 1);
        }
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_a0);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = (local_b8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xda,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_a0._M_dataplus._M_p + 8))();
          }
        }
        if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_0011012f;
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8;
        __ptr_00 = local_b8;
        goto LAB_0010ff7b;
      }
      testing::Message::Message((Message *)&local_40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,local_20,(AssertionResult *)"arena.isEmpty()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd7,local_a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if (local_40._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
      if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_18,local_18);
      }
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon(&local_38);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon(&local_b0);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)local_c0);
    }
    memt::Arena::
    PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
    ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                        *)local_80);
  }
  else {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_80,(AssertionResult *)"arena.isEmpty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0xd0,local_a0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_c0);
LAB_0010ff35:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_78;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c0 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(size_type *)local_c0 + 8))();
    }
    __ptr_00 = local_78;
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0011012f;
LAB_0010ff7b:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
LAB_0011012f:
  memt::Arena::~Arena((Arena *)&local_60);
  return;
}

Assistant:

TEST(Arena, PtrNoConNoDecon) {
  memt::Arena arena;
  ASSERT_TRUE(arena.isEmpty());
  {
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr1(arena);
	ASSERT_FALSE(arena.isEmpty());
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr2(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr3(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr4(arena);
	ASSERT_FALSE(arena.isEmpty());
  }
  ASSERT_TRUE(arena.isEmpty());
  ASSERT_EQ(PtrNoConNoDeconHelper::resetLog(), "");
}